

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffercache_test.cpp
# Opt level: O1

void __thiscall BufferCache_Basics_Test::TestBody(BufferCache_Basics_Test *this)

{
  BufferCache<int> *pBVar1;
  bool bVar2;
  long lVar3;
  char *pcVar4;
  char *in_R9;
  ulong uVar5;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  AssertionResult gtest_ar_5;
  int *ptr2;
  vector<int,_std::allocator<int>_> v2;
  int *ptr;
  vector<int,_std::allocator<int>_> v;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_90;
  AssertHelper local_88;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  vector<int,_std::allocator<int>_> local_78;
  AssertHelper local_60;
  AssertHelper local_58;
  string local_50;
  
  pBVar1 = pbrt::intBufferCache;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,
                         pbrt::intBufferCache != (BufferCache<int> *)0x0);
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  if (pbrt::intBufferCache == (BufferCache<int> *)0x0) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_50,(internal *)&local_78,(AssertionResult *)"intBufferCache == nullptr","true"
               ,"false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/buffercache_test.cpp"
               ,0xf,local_50._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (local_98.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_98.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_98.ptr_ + 8))();
      }
      local_98.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (pBVar1 != (BufferCache<int> *)0x0) {
    local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x200000001;
    local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x400000003;
    local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_4_ = 5;
    __l._M_len = 5;
    __l._M_array = (iterator)&local_78;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_50,__l,(allocator_type *)&local_98);
    local_60.data_ = (AssertHelperData *)((ulong)local_60.data_._4_4_ << 0x20);
    local_98.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         pbrt::intBufferCache->bytesUsed;
    testing::internal::CmpHelperEQ<int,unsigned_long>
              ((internal *)&local_78,"0","intBufferCache->BytesUsed()",(int *)&local_60,
               (unsigned_long *)&local_98);
    if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_98);
      if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish == (pointer)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/buffercache_test.cpp"
                 ,0x13,pcVar4);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      if (local_98.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (local_98.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_98.ptr_ + 8))();
        }
        local_98.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_60.data_ =
         (AssertHelperData *)
         pbrt::BufferCache<int>::LookupOrAdd
                   (pbrt::intBufferCache,(vector<int,_std::allocator<int>_> *)&local_50);
    if ((pointer)local_50._M_string_length != local_50._M_dataplus._M_p) {
      lVar3 = 0;
      uVar5 = 0;
      do {
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&local_78,"ptr[i]","v[i]",
                   (int *)((long)&(local_60.data_)->type + lVar3),
                   (int *)(local_50._M_dataplus._M_p + lVar3));
        if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_98);
          pcVar4 = "";
          if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish != (pointer)0x0) {
            pcVar4 = *(char **)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_88,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/buffercache_test.cpp"
                     ,0x17,pcVar4);
          testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_98);
          testing::internal::AssertHelper::~AssertHelper(&local_88);
          if (local_98.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) &&
               (local_98.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_98.ptr_ + 8))();
            }
            local_98.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        uVar5 = uVar5 + 1;
        lVar3 = lVar3 + 4;
      } while (uVar5 < (ulong)((long)(local_50._M_string_length - (long)local_50._M_dataplus._M_p)
                              >> 2));
    }
    local_98.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000014;
    local_88.data_ = (AssertHelperData *)pbrt::intBufferCache->bytesUsed;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&local_78,"5 * sizeof(int)","intBufferCache->BytesUsed()",
               (unsigned_long *)&local_98,(unsigned_long *)&local_88);
    if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_98);
      if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish == (pointer)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/buffercache_test.cpp"
                 ,0x19,pcVar4);
      testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_88);
      if (local_98.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (local_98.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_98.ptr_ + 8))();
        }
        local_98.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_98.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         pbrt::BufferCache<int>::LookupOrAdd
                   (pbrt::intBufferCache,(vector<int,_std::allocator<int>_> *)&local_50);
    testing::internal::CmpHelperEQ<int_const*,int_const*>
              ((internal *)&local_78,"ptr","intBufferCache->LookupOrAdd(v)",(int **)&local_60,
               (int **)&local_98);
    if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_98);
      if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish == (pointer)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/buffercache_test.cpp"
                 ,0x1b,pcVar4);
      testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_88);
      if (local_98.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (local_98.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_98.ptr_ + 8))();
        }
        local_98.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_98.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000014;
    local_88.data_ = (AssertHelperData *)pbrt::intBufferCache->bytesUsed;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&local_78,"5 * sizeof(int)","intBufferCache->BytesUsed()",
               (unsigned_long *)&local_98,(unsigned_long *)&local_88);
    if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_98);
      if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish == (pointer)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/buffercache_test.cpp"
                 ,0x1d,pcVar4);
      testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_88);
      if (local_98.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (local_98.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_98.ptr_ + 8))();
        }
        local_98.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_98.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x200000001;
    sStack_90.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x400000003;
    __l_00._M_len = 4;
    __l_00._M_array = (iterator)&local_98;
    std::vector<int,_std::allocator<int>_>::vector(&local_78,__l_00,(allocator_type *)&local_88);
    local_88.data_ =
         (AssertHelperData *)pbrt::BufferCache<int>::LookupOrAdd(pbrt::intBufferCache,&local_78);
    testing::internal::CmpHelperNE<int_const*,int_const*>
              ((internal *)&local_98,"ptr","ptr2",(int **)&local_60,(int **)&local_88);
    if (local_98.ptr_._0_1_ == (allocator_type)0x0) {
      testing::Message::Message((Message *)&local_80);
      if (sStack_90.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         ) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((sStack_90.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/buffercache_test.cpp"
                 ,0x21,pcVar4);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_80);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if (local_80.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (local_80.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_80.ptr_ + 8))();
        }
        local_80.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&sStack_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      lVar3 = 0;
      uVar5 = 0;
      do {
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&local_98,"ptr2[i]","v2[i]",
                   (int *)((long)&(local_88.data_)->type + lVar3),
                   (int *)((long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start + lVar3));
        if (local_98.ptr_._0_1_ == (allocator_type)0x0) {
          testing::Message::Message((Message *)&local_80);
          pcVar4 = "";
          if (sStack_90.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar4 = ((sStack_90.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_58,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/buffercache_test.cpp"
                     ,0x23,pcVar4);
          testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_80);
          testing::internal::AssertHelper::~AssertHelper(&local_58);
          if (local_80.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) &&
               (local_80.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_80.ptr_ + 8))();
            }
            local_80.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&sStack_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
        uVar5 = uVar5 + 1;
        lVar3 = lVar3 + 4;
      } while (uVar5 < (ulong)((long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                               (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start >> 2));
    }
    local_80.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000024;
    local_58.data_ = (AssertHelperData *)pbrt::intBufferCache->bytesUsed;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&local_98,"9 * sizeof(int)","intBufferCache->BytesUsed()",
               (unsigned_long *)&local_80,(unsigned_long *)&local_58);
    if (local_98.ptr_._0_1_ == (allocator_type)0x0) {
      testing::Message::Message((Message *)&local_80);
      if (sStack_90.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         ) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((sStack_90.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/buffercache_test.cpp"
                 ,0x25,pcVar4);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_80);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if (local_80.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (local_80.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_80.ptr_ + 8))();
        }
        local_80.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&sStack_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      CONCAT44(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage._4_4_,
                               local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage._0_4_) -
                      (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_50._M_dataplus._M_p != (char *)0x0) {
      operator_delete(local_50._M_dataplus._M_p,
                      local_50.field_2._M_allocated_capacity - (long)local_50._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

TEST(BufferCache, Basics) {
    ASSERT_FALSE(intBufferCache == nullptr);

    std::vector<int> v{1,2,3,4,5};

    EXPECT_EQ(0, intBufferCache->BytesUsed());

    const int *ptr = intBufferCache->LookupOrAdd(v);
    for (size_t i = 0; i < v.size(); ++i)
        EXPECT_EQ(ptr[i], v[i]);

    EXPECT_EQ(5 * sizeof(int), intBufferCache->BytesUsed());

    EXPECT_EQ(ptr, intBufferCache->LookupOrAdd(v));

    EXPECT_EQ(5 * sizeof(int), intBufferCache->BytesUsed());

    std::vector<int> v2{1,2,3,4};
    const int *ptr2 = intBufferCache->LookupOrAdd(v2);
    EXPECT_NE(ptr, ptr2);
    for (size_t i = 0; i < v2.size(); ++i)
        EXPECT_EQ(ptr2[i], v2[i]);

    EXPECT_EQ(9 * sizeof(int), intBufferCache->BytesUsed());
}